

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvkgen.cpp
# Opt level: O3

Command * __thiscall VkSpecParser::parseCommand(Command *__return_storage_ptr__,VkSpecParser *this)

{
  Data *pDVar1;
  int *piVar2;
  Data *pDVar3;
  QArrayData *pQVar4;
  QString *pQVar5;
  char16_t *pcVar6;
  qsizetype qVar7;
  QArrayData *pQVar8;
  char16_t *pcVar9;
  qsizetype qVar10;
  QArrayData *pQVar11;
  char16_t *pcVar12;
  qsizetype qVar13;
  Data *pDVar14;
  TypedName *pTVar15;
  char cVar16;
  undefined1 uVar17;
  int iVar18;
  QString *data;
  iterator iVar19;
  iterator iVar20;
  pointer pTVar21;
  ulong uVar22;
  qsizetype qVar23;
  long lVar24;
  QXmlStreamAttribute *attr;
  long in_FS_OFFSET;
  QStringView QVar25;
  QStringView QVar26;
  QStringView QVar27;
  QStringView QVar28;
  QStringView QVar29;
  QStringView QVar30;
  QStringView QVar31;
  QStringView QVar32;
  QStringView QVar33;
  QStringView QVar34;
  QStringView QVar35;
  QStringView QVar36;
  undefined1 auVar37 [16];
  QString local_150;
  QArrayDataPointer<QString> local_138;
  QArrayData *local_118;
  QString *pQStack_110;
  long local_108;
  QArrayData *local_f8;
  char16_t *pcStack_f0;
  qsizetype local_e8;
  QArrayData *pQStack_e0;
  char16_t *local_d8;
  qsizetype qStack_d0;
  QArrayData *local_c8;
  char16_t *pcStack_c0;
  qsizetype local_b8;
  QArrayDataPointer<VkSpecParser::TypedName> QStack_b0;
  ulong local_98;
  TypedName local_88;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_98 = 0xaaaaaaaaaaaaaaaa;
  local_f8 = (QArrayData *)0x0;
  pcStack_f0 = (char16_t *)0x0;
  local_e8 = 0;
  pQStack_e0 = (QArrayData *)0x0;
  local_d8 = (char16_t *)0x0;
  qStack_d0 = 0;
  local_c8 = (QArrayData *)0x0;
  pcStack_c0 = (char16_t *)0x0;
  local_b8 = 0;
  QStack_b0.d = (Data *)0x0;
  QStack_b0.ptr = (TypedName *)0x0;
  QStack_b0.size = 0;
  local_118 = (QArrayData *)0x0;
  pQStack_110 = (QString *)0x0;
  local_108 = 0;
  QXmlStreamReader::attributes();
  iVar19 = QList<QXmlStreamAttribute>::begin((QList<QXmlStreamAttribute> *)&local_88);
  iVar20 = QList<QXmlStreamAttribute>::end((QList<QXmlStreamAttribute> *)&local_88);
  if (iVar19.i != iVar20.i) {
    do {
      if ((((iVar19.i)->m_name).m_string.size == 3) &&
         (QVar25.m_data = ((iVar19.i)->m_name).m_string.ptr, QVar25.m_size = 3,
         QVar30.m_data = L"api", QVar30.m_size = 3, cVar16 = QtPrivate::equalStrings(QVar25,QVar30),
         cVar16 != '\0')) {
        QString::QString(&local_150,(QChar *)((iVar19.i)->m_value).m_string.ptr,
                         ((iVar19.i)->m_value).m_string.size);
        QString::trimmed_helper((QString *)&local_138);
        pQVar5 = pQStack_110;
        pQVar4 = local_118;
        qVar23 = local_138.size;
        pDVar3 = local_138.d;
        local_138.d = (Data *)local_118;
        local_118 = &pDVar3->super_QArrayData;
        pQStack_110 = local_138.ptr;
        local_138.ptr = pQVar5;
        local_138.size = local_108;
        local_108 = qVar23;
        if (pQVar4 != (QArrayData *)0x0) {
          LOCK();
          (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar4,2,0x10);
          }
        }
        if (&(local_150.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_150.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_150.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_150.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_150.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      iVar19.i = iVar19.i + 1;
    } while (iVar19.i != iVar20.i);
  }
  QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer
            ((QArrayDataPointer<QXmlStreamAttribute> *)&local_88);
  if (local_108 != 0) {
    QString::split(&local_88,&local_118,0x2c,0,1);
    QVar35.m_data = L"vulkan";
    QVar35.m_size = 6;
    cVar16 = QtPrivate::QStringList_contains((QList *)&local_88,QVar35,CaseSensitive);
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_88);
    if (cVar16 == '\0') {
      skip(this);
      (__return_storage_ptr__->args).d.ptr = (TypedName *)0x0;
      (__return_storage_ptr__->args).d.size = 0;
      (__return_storage_ptr__->cmd).typeSuffix.d.size = 0;
      (__return_storage_ptr__->args).d.d = (Data *)0x0;
      (__return_storage_ptr__->cmd).typeSuffix.d.d = (Data *)0x0;
      (__return_storage_ptr__->cmd).typeSuffix.d.ptr = (char16_t *)0x0;
      (__return_storage_ptr__->cmd).type.d.ptr = (char16_t *)0x0;
      (__return_storage_ptr__->cmd).type.d.size = 0;
      (__return_storage_ptr__->cmd).name.d.size = 0;
      (__return_storage_ptr__->cmd).type.d.d = (Data *)0x0;
      (__return_storage_ptr__->cmd).name.d.d = (Data *)0x0;
      (__return_storage_ptr__->cmd).name.d.ptr = (char16_t *)0x0;
      __return_storage_ptr__->deviceLevel = false;
      goto LAB_00103ebd;
    }
  }
  cVar16 = QXmlStreamReader::atEnd();
  while (cVar16 == '\0') {
    QXmlStreamReader::readNext();
    iVar18 = QXmlStreamReader::tokenType();
    if (iVar18 == 5) {
      auVar37 = QXmlStreamReader::name();
      if ((auVar37._0_8_ == 7) &&
         (QVar26.m_data = auVar37._8_8_, QVar26.m_size = 7, QVar31.m_data = L"command",
         QVar31.m_size = 7, cVar16 = QtPrivate::equalStrings(QVar26,QVar31), cVar16 != '\0')) break;
    }
    iVar18 = QXmlStreamReader::tokenType();
    if (iVar18 == 4) {
      local_138.d = (Data *)0x0;
      local_138.ptr = (QString *)0x10b128;
      local_138.size = 5;
      local_150.d.d = (Data *)0x0;
      local_150.d.ptr = L"param";
      local_150.d.size = 5;
      auVar37 = QXmlStreamReader::name();
      if ((auVar37._0_8_ == 5) &&
         (QVar27.m_data = auVar37._8_8_, QVar27.m_size = 5, QVar32.m_data = L"proto",
         QVar32.m_size = 5, cVar16 = QtPrivate::equalStrings(QVar27,QVar32), cVar16 != '\0')) {
        parseParamOrProto(&local_88,this,(QString *)&local_138);
        pDVar1 = local_88.typeSuffix.d.d;
        qVar10 = local_b8;
        pcVar12 = pcStack_c0;
        pQVar11 = local_c8;
        qVar7 = qStack_d0;
        pcVar9 = local_d8;
        pQVar8 = pQStack_e0;
        qVar23 = local_e8;
        pcVar6 = pcStack_f0;
        pQVar4 = local_f8;
        local_f8 = &(local_88.name.d.d)->super_QArrayData;
        pcStack_f0 = local_88.name.d.ptr;
        local_88.name.d.d = (Data *)pQVar4;
        local_88.name.d.ptr = pcVar6;
        local_e8 = local_88.name.d.size;
        local_88.name.d.size = qVar23;
        pQStack_e0 = &(local_88.type.d.d)->super_QArrayData;
        local_d8 = local_88.type.d.ptr;
        local_88.type.d.d = (Data *)pQVar8;
        local_88.type.d.ptr = pcVar9;
        qStack_d0 = local_88.type.d.size;
        local_88.type.d.size = qVar7;
        local_88.typeSuffix.d.d = (Data *)local_c8;
        local_c8 = &pDVar1->super_QArrayData;
        pcStack_c0 = local_88.typeSuffix.d.ptr;
        local_88.typeSuffix.d.ptr = pcVar12;
        local_b8 = local_88.typeSuffix.d.size;
        local_88.typeSuffix.d.size = qVar10;
        if (pQVar11 != (QArrayData *)0x0) {
          LOCK();
          (pQVar11->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar11->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar11->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar11,2,0x10);
          }
        }
        if (&(local_88.type.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_88.type.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_88.type.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
               -1;
          UNLOCK();
          if (((local_88.type.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
              0) {
            QArrayData::deallocate(&(local_88.type.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_88.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_88.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_88.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
               -1;
          UNLOCK();
          if (((local_88.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
              0) {
            QArrayData::deallocate(&(local_88.name.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      else {
        auVar37 = QXmlStreamReader::name();
        if ((auVar37._0_8_ == 5) &&
           (QVar28.m_data = auVar37._8_8_, QVar28.m_size = 5, QVar33.m_data = L"param",
           QVar33.m_size = 5, cVar16 = QtPrivate::equalStrings(QVar28,QVar33), cVar16 != '\0')) {
          parseParamOrProto(&local_88,this,&local_150);
          QtPrivate::QGenericArrayOps<VkSpecParser::TypedName>::emplace<VkSpecParser::TypedName>
                    ((QGenericArrayOps<VkSpecParser::TypedName> *)&QStack_b0,QStack_b0.size,
                     &local_88);
          QList<VkSpecParser::TypedName>::end((QList<VkSpecParser::TypedName> *)&QStack_b0);
          if (&(local_88.typeSuffix.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_88.typeSuffix.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
            _M_i = ((local_88.typeSuffix.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_88.typeSuffix.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                ._M_i == 0) {
              QArrayData::deallocate(&(local_88.typeSuffix.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_88.type.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_88.type.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_88.type.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 + -1;
            UNLOCK();
            if (((local_88.type.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                == 0) {
              QArrayData::deallocate(&(local_88.type.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_88.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_88.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_88.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 + -1;
            UNLOCK();
            if (((local_88.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                == 0) {
              QArrayData::deallocate(&(local_88.name.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
        else {
          skip(this);
        }
      }
      if (&(local_150.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_150.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_150.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_150.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_150.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_138.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_138.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_138.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_138.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_138.d)->super_QArrayData,2,0x10);
        }
      }
    }
    cVar16 = QXmlStreamReader::atEnd();
  }
  local_98 = local_98 & 0xffffffffffffff00;
  if (QStack_b0.size == 0) {
    uVar17 = false;
    qVar23 = 0;
  }
  else {
    local_88.name.d.d = (Data *)0x0;
    local_88.name.d.ptr = L"VkDevice";
    local_88.name.d.size = 8;
    local_88.type.d.d = (Data *)0x0;
    local_88.type.d.ptr = L"VkQueue";
    local_88.type.d.size = 7;
    local_88.typeSuffix.d.d = (Data *)0x0;
    local_88.typeSuffix.d.ptr = L"VkCommandBuffer";
    local_88.typeSuffix.d.size = 0xf;
    local_138.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_138.ptr = (QString *)QArrayData::allocate((QArrayData **)&local_138,0x18,0x10,3,KeepSize);
    local_138.size = 0;
    uVar22 = 0xffffffffffffffe8;
    do {
      pDVar1 = *(Data **)((long)&local_88.type.d.d + uVar22);
      local_138.ptr[local_138.size].d.d = pDVar1;
      local_138.ptr[local_138.size].d.ptr = *(char16_t **)((long)&local_88.type.d.ptr + uVar22);
      local_138.ptr[local_138.size].d.size = *(qsizetype *)((long)&local_88.type.d.size + uVar22);
      if (pDVar1 != (Data *)0x0) {
        LOCK();
        (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_138.size = local_138.size + 1;
      uVar22 = uVar22 + 0x18;
    } while (uVar22 < 0x30);
    lVar24 = 0x30;
    do {
      piVar2 = *(int **)((long)&local_88.name.d.d + lVar24);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          QArrayData::deallocate(*(QArrayData **)((long)&local_88.name.d.d + lVar24),2,0x10);
        }
      }
      lVar24 = lVar24 + -0x18;
    } while (lVar24 != -0x18);
    pTVar21 = QList<VkSpecParser::TypedName>::data((QList<VkSpecParser::TypedName> *)&QStack_b0);
    QVar36.m_data = (pTVar21->type).d.ptr;
    QVar36.m_size = (pTVar21->type).d.size;
    cVar16 = QtPrivate::QStringList_contains((QList *)&local_138,QVar36,CaseSensitive);
    if ((cVar16 != '\0') &&
       ((local_e8 != 0x13 ||
        (QVar29.m_data = pcStack_f0, QVar29.m_size = 0x13, QVar34.m_data = L"vkGetDeviceProcAddr",
        QVar34.m_size = 0x13, cVar16 = QtPrivate::equalStrings(QVar29,QVar34), cVar16 == '\0')))) {
      local_98 = CONCAT71(local_98._1_7_,1);
    }
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_138);
    qVar23 = QStack_b0.size;
    uVar17 = (undefined1)local_98;
  }
  pTVar15 = QStack_b0.ptr;
  pDVar14 = QStack_b0.d;
  qVar13 = local_b8;
  pcVar12 = pcStack_c0;
  pQVar11 = local_c8;
  qVar10 = qStack_d0;
  pcVar9 = local_d8;
  pQVar8 = pQStack_e0;
  qVar7 = local_e8;
  pcVar6 = pcStack_f0;
  pQVar4 = local_f8;
  local_f8 = (QArrayData *)0x0;
  pcStack_f0 = (char16_t *)0x0;
  (__return_storage_ptr__->cmd).name.d.d = (Data *)pQVar4;
  (__return_storage_ptr__->cmd).name.d.ptr = pcVar6;
  local_e8 = 0;
  (__return_storage_ptr__->cmd).name.d.size = qVar7;
  pQStack_e0 = (QArrayData *)0x0;
  local_d8 = (char16_t *)0x0;
  (__return_storage_ptr__->cmd).type.d.d = (Data *)pQVar8;
  (__return_storage_ptr__->cmd).type.d.ptr = pcVar9;
  qStack_d0 = 0;
  (__return_storage_ptr__->cmd).type.d.size = qVar10;
  local_c8 = (QArrayData *)0x0;
  pcStack_c0 = (char16_t *)0x0;
  (__return_storage_ptr__->cmd).typeSuffix.d.d = (Data *)pQVar11;
  (__return_storage_ptr__->cmd).typeSuffix.d.ptr = pcVar12;
  local_b8 = 0;
  (__return_storage_ptr__->cmd).typeSuffix.d.size = qVar13;
  QStack_b0.d = (Data *)0x0;
  QStack_b0.ptr = (TypedName *)0x0;
  (__return_storage_ptr__->args).d.d = pDVar14;
  (__return_storage_ptr__->args).d.ptr = pTVar15;
  QStack_b0.size = 0;
  (__return_storage_ptr__->args).d.size = qVar23;
  __return_storage_ptr__->deviceLevel = (bool)uVar17;
LAB_00103ebd:
  if (local_118 != (QArrayData *)0x0) {
    LOCK();
    (local_118->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_118->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_118->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_118,2,0x10);
    }
  }
  QArrayDataPointer<VkSpecParser::TypedName>::~QArrayDataPointer(&QStack_b0);
  if (local_c8 != (QArrayData *)0x0) {
    LOCK();
    (local_c8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_c8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_c8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_c8,2,0x10);
    }
  }
  if (pQStack_e0 != (QArrayData *)0x0) {
    LOCK();
    (pQStack_e0->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQStack_e0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQStack_e0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQStack_e0,2,0x10);
    }
  }
  if (local_f8 != (QArrayData *)0x0) {
    LOCK();
    (local_f8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_f8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_f8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_f8,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

VkSpecParser::Command VkSpecParser::parseCommand()
{
    Command c;

    // <command successcodes="VK_SUCCESS" ...>
    //   <proto><type>VkResult</type> <name>vkCreateInstance</name></proto>
    //   <param>const <type>VkInstanceCreateInfo</type>* <name>pCreateInfo</name></param>
    //   <param optional="true">const <type>VkAllocationCallbacks</type>* <name>pAllocator</name></param>
    //   <param><type>VkInstance</type>* <name>pInstance</name></param>

    QString api;
    for (const QXmlStreamAttribute &attr : m_reader.attributes()) {
        if (attr.name() == QStringLiteral("api"))
            api = attr.value().toString().trimmed();
    }
    // skip commands with api="vulkansc", but the api attribute is optional
    if (!api.isEmpty() && !api.split(',').contains(QStringLiteral("vulkan"))) {
        skip();
        return {};
    }

    while (!m_reader.atEnd()) {
        m_reader.readNext();
        if (m_reader.isEndElement() && m_reader.name() == QStringLiteral("command"))
            break;
        if (m_reader.isStartElement()) {
            const QString protoStr = QStringLiteral("proto");
            const QString paramStr = QStringLiteral("param");
            if (m_reader.name() == protoStr) {
                c.cmd = parseParamOrProto(protoStr);
            } else if (m_reader.name() == paramStr) {
                c.args.append(parseParamOrProto(paramStr));
            } else {
                skip();
            }
        }
    }

    c.deviceLevel = false;
    if (!c.args.isEmpty()) {
        QStringList dispatchableDeviceAndChildTypes {
            QStringLiteral("VkDevice"),
            QStringLiteral("VkQueue"),
            QStringLiteral("VkCommandBuffer")
        };
        if (dispatchableDeviceAndChildTypes.contains(c.args[0].type)
                && c.cmd.name != QStringLiteral("vkGetDeviceProcAddr"))
        {
            c.deviceLevel = true;
        }
    }

    return c;
}